

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

void fsnav_free(void)

{
  fsnav_struct *pfVar1;
  long lVar2;
  ulong uVar3;
  
  fsnav_free_null(&(fsnav->core).plugins);
  pfVar1 = fsnav;
  (fsnav->core).plugin_count = 0;
  fsnav_free_null(&pfVar1->cfg);
  pfVar1 = fsnav;
  fsnav->cfglength = 0;
  pfVar1->cfg_settings = (char *)0x0;
  pfVar1->settings_length = 0;
  fsnav_free_imu();
  pfVar1 = fsnav;
  if (fsnav->gnss != (fsnav_gnss *)0x0) {
    lVar2 = 0;
    for (uVar3 = 0; uVar3 < fsnav->gnss_count; uVar3 = uVar3 + 1) {
      fsnav_free_gnss((fsnav_gnss *)((long)(fsnav->gnss->settings).ant_pos + lVar2 + -0x40));
      lVar2 = lVar2 + 0x1d8;
    }
    free(fsnav->gnss);
    pfVar1 = fsnav;
    fsnav->gnss = (fsnav_gnss *)0x0;
  }
  pfVar1->gnss_count = 0;
  fsnav_free_air();
  fsnav_free_ref();
  fsnav_free_null(&(fsnav->sol).metrics);
  return;
}

Assistant:

void fsnav_free()
{
	size_t r;

	// core
	fsnav_free_null((void**)(&(fsnav->core.plugins)));
	fsnav->core.plugin_count = 0;

	// configuration string
	fsnav_free_null((void**)(&(fsnav->cfg)));
	fsnav->cfglength = 0;
	fsnav->cfg_settings = NULL;
	fsnav->settings_length = 0;

	// imu
	fsnav_free_imu();

	// gnss
	if (fsnav->gnss != NULL) {
		for (r = 0; r < fsnav->gnss_count; r++)
			fsnav_free_gnss(&(fsnav->gnss[r]));
		free((void*)(fsnav->gnss));
		fsnav->gnss = NULL;
	}
	fsnav->gnss_count = 0;

	// air data
	fsnav_free_air();

	// reference data
	fsnav_free_ref();

	// solution
	fsnav_free_sol(&(fsnav->sol));
}